

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

c_int csc_cumsum(c_int *p,c_int *c,c_int n)

{
  c_int cVar1;
  long lVar2;
  long lVar3;
  
  cVar1 = -1;
  if (c != (c_int *)0x0 && p != (c_int *)0x0) {
    if (n < 1) {
      cVar1 = 0;
    }
    else {
      lVar2 = 0;
      lVar3 = 0;
      do {
        p[lVar2] = lVar3;
        cVar1 = c[lVar2] + lVar3;
        c[lVar2] = lVar3;
        lVar2 = lVar2 + 1;
        lVar3 = cVar1;
      } while (n != lVar2);
    }
    p[n] = cVar1;
  }
  return cVar1;
}

Assistant:

c_int csc_cumsum(c_int *p, c_int *c, c_int n) {
  c_int i, nz = 0;

  if (!p || !c) return -1;  /* check inputs */

  for (i = 0; i < n; i++)
  {
    p[i] = nz;
    nz  += c[i];
    c[i] = p[i];
  }
  p[n] = nz;
  return nz; /* return sum (c [0..n-1]) */
}